

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.cpp
# Opt level: O2

bool setup(int argc,char **argv,string *filename,uint32_t *width,uint32_t *height,uint32_t *bgColor)

{
  int iVar1;
  stringstream ss;
  long local_1b8 [2];
  long local_1a8;
  uint auStack_1a0 [2];
  byte abStack_198 [8];
  uint auStack_190 [88];
  
  if (1 < argc) {
    std::__cxx11::string::assign((char *)filename);
    if (argc == 2) {
      return true;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::operator<<((ostream *)&local_1a8,argv[2]);
    std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
    if (((abStack_198[*(long *)(local_1b8[0] + -0x18)] & 5) == 0) &&
       (iVar1 = std::istream::get(), iVar1 == 0x78)) {
      std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      if ((uint)argc < 4) {
        return true;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
      std::operator<<((ostream *)&local_1a8,argv[3]);
      *(uint *)((long)auStack_1a0 + *(long *)(local_1b8[0] + -0x18)) =
           *(uint *)((long)auStack_1a0 + *(long *)(local_1b8[0] + -0x18)) & 0xffffffb5 | 8;
      std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      return true;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  return false;
}

Assistant:

bool setup(int argc, char** argv, std::string& filename, std::uint32_t& width, std::uint32_t& height, std::uint32_t& bgColor)
{
    if(argc > 1) filename.assign(argv[1]);
    if(argc > 2) {
        std::stringstream ss;
        ss << argv[2];
        ss >> width;

        if(ss.fail() || ss.get() != 'x')
            return false;
        ss >> height;
    }

    if(argc > 3) {
        std::stringstream ss;
        ss << std::hex << argv[3];
        ss >> std::hex >> bgColor;
    }

    return argc > 1;
}